

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int set_definition(coda_product **product,coda_product_definition *definition)

{
  coda_format cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long *plVar5;
  int64_t **ppiVar6;
  int local_28;
  int i;
  int num_product_variables;
  coda_product_definition *definition_local;
  coda_product **product_local;
  
  if (definition == (coda_product_definition *)0x0) {
    if (((*product)->format == coda_format_binary) || ((*product)->format == coda_format_ascii)) {
      coda_set_error(-200,(char *)0x0);
      product_local._4_4_ = -1;
    }
    else {
      product_local._4_4_ = 0;
    }
  }
  else if (((*product)->format == definition->format) ||
          (((*product)->format == coda_format_binary && (definition->format == coda_format_ascii))))
  {
    if ((definition->initialized == 0) &&
       (iVar2 = coda_read_product_definition(definition), iVar2 != 0)) {
      product_local._4_4_ = -1;
    }
    else {
      cVar1 = definition->format;
      if (cVar1 == coda_format_ascii) {
        iVar2 = coda_ascii_reopen_with_definition(product,definition);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else if (cVar1 == coda_format_binary) {
        iVar2 = coda_bin_reopen_with_definition(product,definition);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else if (cVar1 == coda_format_xml) {
        iVar2 = coda_xml_reopen_with_definition(product,definition);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else {
        (*product)->product_definition = definition;
      }
      if (0 < (*product)->product_definition->num_product_variables) {
        iVar2 = (*product)->product_definition->num_product_variables;
        plVar5 = (long *)malloc((long)iVar2 << 3);
        (*product)->product_variable_size = plVar5;
        if ((*product)->product_variable_size == (long *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",(long)iVar2 << 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                         ,0x1f1);
          return -1;
        }
        ppiVar6 = (int64_t **)malloc((long)iVar2 << 3);
        (*product)->product_variable = ppiVar6;
        if ((*product)->product_variable == (int64_t **)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",(long)iVar2 << 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                         ,0x1f8);
          return -1;
        }
        for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
          (*product)->product_variable[local_28] = (int64_t *)0x0;
        }
      }
      product_local._4_4_ = 0;
    }
  }
  else {
    pcVar3 = coda_type_get_format_name(definition->format);
    pcVar4 = coda_type_get_format_name((*product)->format);
    coda_set_error(-200,"cannot use %s definition for %s product",pcVar3,pcVar4);
    product_local._4_4_ = -1;
  }
  return product_local._4_4_;
}

Assistant:

static int set_definition(coda_product **product, coda_product_definition *definition)
{
    if (definition == NULL)
    {
        if ((*product)->format == coda_format_binary || (*product)->format == coda_format_ascii)
        {
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, NULL);
            return -1;
        }
        /* if definition == NULL we have nothing to do */
        return 0;
    }

    if ((*product)->format != definition->format &&
        !((*product)->format == coda_format_binary && definition->format == coda_format_ascii))
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "cannot use %s definition for %s product",
                       coda_type_get_format_name(definition->format), coda_type_get_format_name((*product)->format));
        return -1;
    }

    if (!definition->initialized)
    {
        /* make sure that the root type and product variables of the product definition are initialized */
        if (coda_read_product_definition(definition) != 0)
        {
            return -1;
        }
    }

    /* unlike the coda_<backend>_reopen functions, the coda_<backend>_reopen_with_definition functions are _not_
     * responsible for closing the input product (even when errors occur)
     */
    switch (definition->format)
    {
        case coda_format_ascii:
            if (coda_ascii_reopen_with_definition(product, definition) != 0)
            {
                return -1;
            }
            break;
        case coda_format_binary:
            if (coda_bin_reopen_with_definition(product, definition) != 0)
            {
                return -1;
            }
            break;
        case coda_format_xml:
            if (coda_xml_reopen_with_definition(product, definition) != 0)
            {
                return -1;
            }
            break;
        default:
            /* self describing format */
            (*product)->product_definition = definition;
            break;
    }

    /* initialize product variables */
    if ((*product)->product_definition->num_product_variables > 0)
    {
        int num_product_variables;
        int i;

        num_product_variables = (*product)->product_definition->num_product_variables;
        (*product)->product_variable_size = malloc(num_product_variables * sizeof(long *));
        if ((*product)->product_variable_size == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           num_product_variables * sizeof(long *), __FILE__, __LINE__);
            return -1;
        }
        (*product)->product_variable = malloc(num_product_variables * sizeof(int64_t **));
        if ((*product)->product_variable == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           num_product_variables * sizeof(int64_t **), __FILE__, __LINE__);
            return -1;
        }

        for (i = 0; i < num_product_variables; i++)
        {
            (*product)->product_variable[i] = NULL;
        }
    }

    return 0;
}